

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa_test.cc
# Opt level: O3

void __thiscall
DSATest_GenerateParamsTooLarge_Test::TestBody(DSATest_GenerateParamsTooLarge_Test *this)

{
  int iVar1;
  char *in_R9;
  char *expected_predicate_value;
  UniquePtr<DSA> dsa;
  AssertHelper local_58;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_50;
  internal local_48 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  string local_38;
  unique_ptr<dsa_st,_bssl::internal::Deleter> local_18;
  
  local_18._M_t.super___uniq_ptr_impl<dsa_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_dsa_st_*,_bssl::internal::Deleter>.super__Head_base<0UL,_dsa_st_*,_false>.
  _M_head_impl = (__uniq_ptr_data<dsa_st,_bssl::internal::Deleter,_true,_true>)DSA_new();
  local_48[0] = (internal)
                ((tuple<dsa_st_*,_bssl::internal::Deleter>)
                 local_18._M_t.super___uniq_ptr_impl<dsa_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_dsa_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_dsa_st_*,_false>._M_head_impl !=
                (_Head_base<0UL,_dsa_st_*,_false>)0x0);
  local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((tuple<dsa_st_*,_bssl::internal::Deleter>)
      local_18._M_t.super___uniq_ptr_impl<dsa_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_dsa_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_dsa_st_*,_false>._M_head_impl == (_Head_base<0UL,_dsa_st_*,_false>)0x0)
  {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_38,local_48,(AssertionResult *)0x5a839a,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dsa/dsa_test.cc"
               ,0xc4,local_38._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_50);
  }
  else {
    expected_predicate_value = (char *)0x0;
    iVar1 = DSA_generate_parameters_ex
                      ((DSA *)local_18._M_t.super___uniq_ptr_impl<dsa_st,_bssl::internal::Deleter>.
                              _M_t.super__Tuple_impl<0UL,_dsa_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_dsa_st_*,_false>._M_head_impl,0x2711,
                       (uint8_t *)0x0,0,(int *)0x0,(unsigned_long *)0x0,(BN_GENCB *)0x0);
    local_48[0] = (internal)(iVar1 == 0);
    local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((bool)local_48[0]) goto LAB_00266056;
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_38,local_48,
               (AssertionResult *)
               "DSA_generate_parameters_ex( dsa.get(), 10001, nullptr, 0, nullptr, nullptr, nullptr)"
               ,"true","false",expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dsa/dsa_test.cc"
               ,200,local_38._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_50);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if (local_50._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_50._M_head_impl + 8))();
  }
  if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_40,local_40);
  }
LAB_00266056:
  std::unique_ptr<dsa_st,_bssl::internal::Deleter>::~unique_ptr(&local_18);
  return;
}

Assistant:

TEST(DSATest, GenerateParamsTooLarge) {
  bssl::UniquePtr<DSA> dsa(DSA_new());
  ASSERT_TRUE(dsa);
  EXPECT_FALSE(DSA_generate_parameters_ex(
      dsa.get(), 10001, /*seed=*/nullptr, /*seed_len=*/0,
      /*out_counter=*/nullptr, /*out_h=*/nullptr,
      /*cb=*/nullptr));
}